

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data.cc
# Opt level: O3

bool __thiscall
bssl::VerifySignedData
          (bssl *this,SignatureAlgorithm algorithm,Input signed_data,BitString *signature_value,
          EVP_PKEY *public_key,SignatureVerifyCache *cache)

{
  uint8_t *data;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint8_t *data_00;
  size_t length;
  undefined8 *puVar4;
  undefined4 in_register_00000034;
  char *pcVar5;
  bool bVar6;
  string cache_key;
  EVP_PKEY_CTX *pctx;
  ScopedEVP_MD_CTX ctx;
  uint8_t digest [32];
  uint64_t local_170;
  EVP_MD *local_160;
  undefined4 local_154;
  uint64_t local_150;
  uint8_t *local_148;
  uchar *local_140;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  CBB local_118;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  SHA256_CTX local_c8;
  uchar local_58 [32];
  undefined1 local_38 [8];
  
  local_148 = (uint8_t *)CONCAT44(in_register_00000034,algorithm);
  puVar4 = (undefined8 *)signed_data.data_.size_;
  local_140 = signed_data.data_.data_;
  switch((ulong)this & 0xffffffff) {
  case 0:
    iVar3 = 6;
    local_170 = 0xc;
    pcVar5 = "SignatureAlgorithm::kRsaPkcs1Sha1";
    break;
  case 1:
    iVar3 = 6;
    local_170 = 0xe;
    pcVar5 = "SignatureAlgorithm::kRsaPkcs1Sha256";
    goto LAB_004b9524;
  case 2:
    iVar3 = 6;
    local_170 = 0xe;
    pcVar5 = "SignatureAlgorithm::kRsaPkcs1Sha384";
    goto LAB_004b9545;
  case 3:
    iVar3 = 6;
    local_170 = 0xe;
    pcVar5 = "SignatureAlgorithm::kRsaPkcs1Sha512";
    goto LAB_004b94eb;
  case 4:
    iVar3 = 0x198;
    local_170 = 9;
    pcVar5 = "SignatureAlgorithm::kEcdsaSha1";
    break;
  case 5:
    iVar3 = 0x198;
    local_170 = 0xb;
    pcVar5 = "SignatureAlgorithm::kEcdsaSha256";
LAB_004b9524:
    bVar6 = false;
LAB_004b9596:
    pcVar5 = pcVar5 + 0x15;
    local_160 = EVP_sha256();
    goto LAB_004b95a0;
  case 6:
    iVar3 = 0x198;
    local_170 = 0xb;
    pcVar5 = "SignatureAlgorithm::kEcdsaSha384";
LAB_004b9545:
    pcVar5 = pcVar5 + 0x15;
    bVar6 = false;
LAB_004b954e:
    local_160 = EVP_sha384();
    goto LAB_004b95a0;
  case 7:
    iVar3 = 0x198;
    local_170 = 0xb;
    pcVar5 = "SignatureAlgorithm::kEcdsaSha512";
LAB_004b94eb:
    pcVar5 = pcVar5 + 0x15;
    bVar6 = false;
LAB_004b9572:
    local_160 = EVP_sha512();
    goto LAB_004b95a0;
  case 8:
    iVar3 = 6;
    bVar6 = true;
    local_170 = 0xc;
    pcVar5 = "SignatureAlgorithm::kRsaPssSha256";
    goto LAB_004b9596;
  case 9:
    iVar3 = 6;
    bVar6 = true;
    local_170 = 0xc;
    pcVar5 = "RsaPssSha384";
    goto LAB_004b954e;
  case 10:
    iVar3 = 6;
    bVar6 = true;
    local_170 = 0xc;
    pcVar5 = "RsaPssSha512";
    goto LAB_004b9572;
  default:
    iVar3 = 1;
    pcVar5 = (char *)0x0;
    local_170 = 0;
    bVar6 = false;
    local_160 = (EVP_MD *)0x0;
    goto LAB_004b95a0;
  }
  pcVar5 = pcVar5 + 0x15;
  bVar6 = false;
  local_160 = EVP_sha1();
LAB_004b95a0:
  iVar2 = EVP_PKEY_id((EVP_PKEY *)signature_value);
  if (iVar3 != iVar2) {
    return false;
  }
  if (*(char *)(puVar4 + 2) != '\0') {
    return false;
  }
  data = (uint8_t *)*puVar4;
  local_150 = puVar4[1];
  local_130 = 0;
  local_128 = 0;
  local_138 = &local_128;
  if (public_key != (EVP_PKEY *)0x0) {
    CBB_zero(&local_118);
    local_154 = 1;
    iVar3 = CBB_init(&local_118,0x80);
    if ((((iVar3 == 0) ||
         (iVar3 = EVP_marshal_public_key(&local_118,(EVP_PKEY *)signature_value), iVar3 == 0)) ||
        (iVar3 = SHA256_Init(&local_c8), iVar3 == 0)) ||
       ((iVar3 = SHA256_Update(&local_c8,&local_154,4), iVar3 == 0 ||
        (bVar1 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                           ((SHA256_CTX *)&local_c8,(uint8_t *)pcVar5,local_170), !bVar1)))) {
LAB_004b971d:
      local_e8 = &local_d8;
      local_e0 = 0;
      local_d8 = 0;
    }
    else {
      data_00 = CBB_data(&local_118);
      length = CBB_len(&local_118);
      bVar1 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                        ((SHA256_CTX *)&local_c8,data_00,length);
      if (((!bVar1) ||
          ((bVar1 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                              ((SHA256_CTX *)&local_c8,data,local_150), !bVar1 ||
           (bVar1 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                              ((SHA256_CTX *)&local_c8,local_148,(uint64_t)local_140), !bVar1)))) ||
         (iVar3 = SHA256_Final(local_58,&local_c8), iVar3 == 0)) goto LAB_004b971d;
      local_e8 = &local_d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,local_58,local_38);
    }
    CBB_cleanup(&local_118);
    ::std::__cxx11::string::operator=((string *)&local_138,(string *)&local_e8);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
    }
    if (local_130 != 0) {
      iVar3 = (**(code **)(*(long *)public_key + 0x18))(public_key,&local_138);
      if (iVar3 == 0) {
        bVar6 = true;
        goto LAB_004b985c;
      }
      if (iVar3 == 1) {
        bVar6 = false;
        goto LAB_004b985c;
      }
    }
  }
  EVP_MD_CTX_init((EVP_MD_CTX *)&local_c8);
  local_118.child = (CBB *)0x0;
  iVar3 = EVP_DigestVerifyInit
                    ((EVP_MD_CTX *)&local_c8,(EVP_PKEY_CTX **)&local_118,local_160,(ENGINE *)0x0,
                     (EVP_PKEY *)signature_value);
  if ((iVar3 == 0) ||
     ((bVar6 && ((iVar3 = EVP_PKEY_CTX_set_rsa_padding((EVP_PKEY_CTX *)local_118.child,6),
                 iVar3 == 0 ||
                 (iVar3 = EVP_PKEY_CTX_set_rsa_pss_saltlen((EVP_PKEY_CTX *)local_118.child,-1),
                 iVar3 == 0)))))) {
    bVar6 = false;
  }
  else {
    iVar3 = EVP_DigestVerify((EVP_MD_CTX *)&local_c8,data,local_150,local_148,(size_t)local_140);
    bVar6 = iVar3 == 1;
    if (local_130 != 0) {
      (**(code **)(*(long *)public_key + 0x10))(public_key,&local_138,iVar3 != 1);
    }
  }
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)&local_c8);
  ERR_clear_error();
LAB_004b985c:
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  return bVar6;
}

Assistant:

bool VerifySignedData(SignatureAlgorithm algorithm, der::Input signed_data,
                      const der::BitString &signature_value,
                      EVP_PKEY *public_key, SignatureVerifyCache *cache) {
  int expected_pkey_id = 1;
  const EVP_MD *digest = nullptr;
  bool is_rsa_pss = false;
  std::string_view cache_algorithm_name;
  switch (algorithm) {
    case SignatureAlgorithm::kRsaPkcs1Sha1:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha1();
      cache_algorithm_name = "RsaPkcs1Sha1";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha256:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha256();
      cache_algorithm_name = "RsaPkcs1Sha256";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha384:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha384();
      cache_algorithm_name = "RsaPkcs1Sha384";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha512:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha512();
      cache_algorithm_name = "RsaPkcs1Sha512";
      break;

    case SignatureAlgorithm::kEcdsaSha1:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha1();
      cache_algorithm_name = "EcdsaSha1";
      break;
    case SignatureAlgorithm::kEcdsaSha256:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha256();
      cache_algorithm_name = "EcdsaSha256";
      break;
    case SignatureAlgorithm::kEcdsaSha384:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha384();
      cache_algorithm_name = "EcdsaSha384";
      break;
    case SignatureAlgorithm::kEcdsaSha512:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha512();
      cache_algorithm_name = "EcdsaSha512";
      break;

    case SignatureAlgorithm::kRsaPssSha256:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha256();
      cache_algorithm_name = "RsaPssSha256";
      is_rsa_pss = true;
      break;
    case SignatureAlgorithm::kRsaPssSha384:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha384();
      cache_algorithm_name = "RsaPssSha384";
      is_rsa_pss = true;
      break;
    case SignatureAlgorithm::kRsaPssSha512:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha512();
      cache_algorithm_name = "RsaPssSha512";
      is_rsa_pss = true;
      break;
  }

  if (expected_pkey_id != EVP_PKEY_id(public_key)) {
    return false;
  }

  // For the supported algorithms the signature value must be a whole
  // number of bytes.
  if (signature_value.unused_bits() != 0) {
    return false;
  }
  der::Input signature_value_bytes = signature_value.bytes();

  std::string cache_key;
  if (cache) {
    cache_key = SignatureVerifyCacheKey(cache_algorithm_name, signed_data,
                                        signature_value_bytes, public_key);
    if (!cache_key.empty()) {
      switch (cache->Check(cache_key)) {
        case SignatureVerifyCache::Value::kValid:
          return true;
        case SignatureVerifyCache::Value::kInvalid:
          return false;
        case SignatureVerifyCache::Value::kUnknown:
          break;
      }
    }
  }

  OpenSSLErrStackTracer err_tracer;

  bssl::ScopedEVP_MD_CTX ctx;
  EVP_PKEY_CTX *pctx = nullptr;  // Owned by |ctx|.

  if (!EVP_DigestVerifyInit(ctx.get(), &pctx, digest, nullptr, public_key)) {
    return false;
  }

  if (is_rsa_pss) {
    // All supported RSASSA-PSS algorithms match signing and MGF-1 digest. They
    // also use the digest length as the salt length, which is specified with -1
    // in OpenSSL's API.
    if (!EVP_PKEY_CTX_set_rsa_padding(pctx, RSA_PKCS1_PSS_PADDING) ||
        !EVP_PKEY_CTX_set_rsa_pss_saltlen(pctx, -1)) {
      return false;
    }
  }

  bool ret = 1 == EVP_DigestVerify(ctx.get(), signature_value_bytes.data(),
                                   signature_value_bytes.size(),
                                   signed_data.data(), signed_data.size());
  if (!cache_key.empty()) {
    cache->Store(cache_key, ret ? SignatureVerifyCache::Value::kValid
                                : SignatureVerifyCache::Value::kInvalid);
  }

  return ret;
}